

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

int fmt::v10::detail::do_count_digits(uint64_t n)

{
  long lVar1;
  
  lVar1 = 0x3f;
  if ((n | 1) != 0) {
    for (; (n | 1) >> lVar1 == 0; lVar1 = lVar1 + -1) {
    }
  }
  return (uint)"\x01\x01\x01\x02\x02\x02\x03\x03\x03\x04\x04\x04\x04\x05\x05\x05\x06\x06\x06\a\a\a\a\b\b\b\t\t\t\n\n\n\n\v\v\v\f\f\f\r\r\r\r\x0e\x0e\x0e\x0f\x0f\x0f\x10\x10\x10\x10\x11\x11\x11\x12\x12\x12\x13\x13\x13\x13\x14"
               [lVar1] -
         (uint)(n < do_count_digits::zero_or_powers_of_10
                    ["\x01\x01\x01\x02\x02\x02\x03\x03\x03\x04\x04\x04\x04\x05\x05\x05\x06\x06\x06\a\a\a\a\b\b\b\t\t\t\n\n\n\n\v\v\v\f\f\f\r\r\r\r\x0e\x0e\x0e\x0f\x0f\x0f\x10\x10\x10\x10\x11\x11\x11\x12\x12\x12\x13\x13\x13\x13\x14"
                     [lVar1]]);
}

Assistant:

inline auto do_count_digits(uint64_t n) -> int {
  // This has comparable performance to the version by Kendall Willets
  // (https://github.com/fmtlib/format-benchmark/blob/master/digits10)
  // but uses smaller tables.
  // Maps bsr(n) to ceil(log10(pow(2, bsr(n) + 1) - 1)).
  static constexpr uint8_t bsr2log10[] = {
      1,  1,  1,  2,  2,  2,  3,  3,  3,  4,  4,  4,  4,  5,  5,  5,
      6,  6,  6,  7,  7,  7,  7,  8,  8,  8,  9,  9,  9,  10, 10, 10,
      10, 11, 11, 11, 12, 12, 12, 13, 13, 13, 13, 14, 14, 14, 15, 15,
      15, 16, 16, 16, 16, 17, 17, 17, 18, 18, 18, 19, 19, 19, 19, 20};
  auto t = bsr2log10[FMT_BUILTIN_CLZLL(n | 1) ^ 63];
  static constexpr const uint64_t zero_or_powers_of_10[] = {
      0, 0, FMT_POWERS_OF_10(1U), FMT_POWERS_OF_10(1000000000ULL),
      10000000000000000000ULL};
  return t - (n < zero_or_powers_of_10[t]);
}